

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__drain(uv_stream_t *stream)

{
  byte *pbVar1;
  uint uVar2;
  uv_shutdown_t *puVar3;
  int iVar4;
  int *piVar5;
  
  if ((stream->write_queue).next != &stream->write_queue) {
    __assert_fail("uv__queue_empty(&stream->write_queue)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x276,"void uv__drain(uv_stream_t *)");
  }
  if ((stream->flags & 1) == 0) {
    uv__io_stop(stream->loop,&stream->io_watcher,4);
  }
  puVar3 = stream->shutdown_req;
  if ((puVar3 != (uv_shutdown_t *)0x0) && ((stream->flags & 0x201) != 0x200)) {
    stream->shutdown_req = (uv_shutdown_t *)0x0;
    uVar2 = (stream->loop->active_reqs).count;
    if (uVar2 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x285,"void uv__drain(uv_stream_t *)");
    }
    (stream->loop->active_reqs).count = uVar2 - 1;
    iVar4 = -0x7d;
    if ((stream->flags & 1) == 0) {
      iVar4 = shutdown((stream->io_watcher).fd,1);
      if (iVar4 == 0) {
        pbVar1 = (byte *)((long)&stream->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        iVar4 = 0;
      }
      else {
        piVar5 = __errno_location();
        iVar4 = -*piVar5;
      }
    }
    if (puVar3->cb != (uv_shutdown_cb)0x0) {
      (*puVar3->cb)(puVar3,iVar4);
      return;
    }
  }
  return;
}

Assistant:

static void uv__drain(uv_stream_t* stream) {
  uv_shutdown_t* req;
  int err;

  assert(uv__queue_empty(&stream->write_queue));
  if (!(stream->flags & UV_HANDLE_CLOSING)) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  if (!uv__is_stream_shutting(stream))
    return;

  req = stream->shutdown_req;
  assert(req);

  if ((stream->flags & UV_HANDLE_CLOSING) ||
      !(stream->flags & UV_HANDLE_SHUT)) {
    stream->shutdown_req = NULL;
    uv__req_unregister(stream->loop, req);

    err = 0;
    if (stream->flags & UV_HANDLE_CLOSING)
      /* The user destroyed the stream before we got to do the shutdown. */
      err = UV_ECANCELED;
    else if (shutdown(uv__stream_fd(stream), SHUT_WR))
      err = UV__ERR(errno);
    else /* Success. */
      stream->flags |= UV_HANDLE_SHUT;

    if (req->cb != NULL)
      req->cb(req, err);
  }
}